

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test2::GPUShaderFP64Test2(GPUShaderFP64Test2 *this,Context *context)

{
  Context *context_local;
  GPUShaderFP64Test2 *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"max_uniform_components",
             "Verifies that maximum allowed uniform components can be used as double-precision float types"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GPUShaderFP64Test2_0323df08;
  this->m_pDispatchCompute = (arbDispatchComputeFunc)0x0;
  std::
  vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
  ::vector(&this->m_shader_stages);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::vector(&this->m_uniform_types);
  this->m_framebuffer_id = 0;
  this->m_texture_id = 0;
  this->m_transform_feedback_buffer_id = 0;
  this->m_uniform_buffer_id = 0;
  this->m_vertex_array_object_id = 0;
  return;
}

Assistant:

GPUShaderFP64Test2::GPUShaderFP64Test2(deqp::Context& context)
	: TestCase(context, "max_uniform_components",
			   "Verifies that maximum allowed uniform components can be used as double-precision float types")
	, m_pDispatchCompute(0)
	, m_framebuffer_id(0)
	, m_texture_id(0)
	, m_transform_feedback_buffer_id(0)
	, m_uniform_buffer_id(0)
	, m_vertex_array_object_id(0)
{
	/* Nothing to be done */
}